

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
* __thiscall
soul::heart::Function::getAllLocalVariables
          (vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
           *__return_storage_ptr__,Function *this)

{
  bool bVar1;
  reference this_00;
  Block *pBVar2;
  Iterator other;
  Statement *object;
  Assignment *pAVar3;
  Expression *pEVar4;
  Variable *pVVar5;
  pool_ref<soul::heart::Variable> local_90;
  pool_ptr<soul::heart::Variable> local_88;
  pool_ptr<soul::heart::Variable> v;
  pool_ptr<const_soul::heart::Assignment> a;
  Statement *s;
  Iterator __end3;
  Iterator local_50;
  Iterator __begin3;
  LinkedList<soul::heart::Statement> *__range3;
  pool_ref<soul::heart::Block> *b;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
  *__range2;
  Function *this_local;
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  *locals;
  
  std::
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  ::vector(__return_storage_ptr__);
  __end2 = std::
           vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ::begin(&this->blocks);
  b = (pool_ref<soul::heart::Block> *)
      std::
      vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
      ::end(&this->blocks);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
                                     *)&b), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
              ::operator*(&__end2);
    pBVar2 = pool_ref<soul::heart::Block>::operator->(this_00);
    __begin3.object = (Statement *)&pBVar2->statements;
    local_50 = LinkedList<soul::heart::Statement>::begin
                         ((LinkedList<soul::heart::Statement> *)__begin3.object);
    other = LinkedList<soul::heart::Statement>::end();
    while (bVar1 = LinkedList<soul::heart::Statement>::Iterator::operator!=(&local_50,other), bVar1)
    {
      object = LinkedList<soul::heart::Statement>::Iterator::operator*(&local_50);
      cast<soul::heart::Assignment_const,soul::heart::Statement>((soul *)&v,object);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&v);
      if (bVar1) {
        pAVar3 = pool_ptr<const_soul::heart::Assignment>::operator->
                           ((pool_ptr<const_soul::heart::Assignment> *)&v);
        bVar1 = pool_ptr<soul::heart::Expression>::operator!=(&pAVar3->target,(void *)0x0);
        if (bVar1) {
          pAVar3 = pool_ptr<const_soul::heart::Assignment>::operator->
                             ((pool_ptr<const_soul::heart::Assignment> *)&v);
          pEVar4 = pool_ptr<soul::heart::Expression>::operator->(&pAVar3->target);
          (*(pEVar4->super_Object)._vptr_Object[6])(&local_88);
          bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_88);
          if (bVar1) {
            pVVar5 = pool_ptr<soul::heart::Variable>::operator->(&local_88);
            bVar1 = Variable::isParameter(pVVar5);
            if (!bVar1) {
              pVVar5 = pool_ptr<soul::heart::Variable>::operator->(&local_88);
              bVar1 = Variable::isState(pVVar5);
              if ((!bVar1) &&
                 (bVar1 = contains<std::vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>,soul::pool_ptr<soul::heart::Variable>&>
                                    (__return_storage_ptr__,&local_88), !bVar1)) {
                pVVar5 = pool_ptr<soul::heart::Variable>::operator*(&local_88);
                pool_ref<soul::heart::Variable>::pool_ref<soul::heart::Variable,void>
                          (&local_90,pVVar5);
                std::
                vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                ::push_back(__return_storage_ptr__,&local_90);
                pool_ref<soul::heart::Variable>::~pool_ref(&local_90);
              }
            }
          }
          pool_ptr<soul::heart::Variable>::~pool_ptr(&local_88);
        }
      }
      pool_ptr<const_soul::heart::Assignment>::~pool_ptr
                ((pool_ptr<const_soul::heart::Assignment> *)&v);
      LinkedList<soul::heart::Statement>::Iterator::operator++(&local_50);
    }
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<pool_ref<Variable>> getAllLocalVariables() const
        {
            std::vector<pool_ref<Variable>> locals;

            for (auto& b : blocks)
                for (auto s : b->statements)
                    if (auto a = cast<const Assignment> (*s))
                        if (a->target != nullptr)
                            if (auto v = a->target->getRootVariable())
                                if (! (v->isParameter() || v->isState() || contains (locals, v)))
                                    locals.push_back (*v);

            return locals;
        }